

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveData.cpp
# Opt level: O2

void __thiscall CDirectiveData::CDirectiveData(CDirectiveData *this)

{
  Endianness EVar1;
  Architecture *pAVar2;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CDirectiveData_001c1c20;
  this->position = 0;
  (this->entries).super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->entries).super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->entries).super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ByteArray::ByteArray(&this->customData);
  (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->normalData).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  this->mode = Invalid;
  this->writeTermination = false;
  pAVar2 = Architecture::current();
  EVar1 = (*pAVar2->_vptr_Architecture[7])(pAVar2);
  this->endianness = EVar1;
  return;
}

Assistant:

CDirectiveData::CDirectiveData()
{
	mode = EncodingMode::Invalid;
	writeTermination = false;
	endianness = Architecture::current().getEndianness();
}